

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O0

bool pd::readPhrases(string *dir_name,
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *data)

{
  bool bVar1;
  byte bVar2;
  type this;
  string *psVar3;
  ostream *poVar4;
  istream *piVar5;
  byte local_3b2;
  byte local_364;
  path local_340;
  undefined1 local_320 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  concr_phrase;
  string line;
  long local_2e0;
  ifstream fi;
  path local_d8;
  path *local_b8;
  path *p;
  bool _foreach_continue345;
  auto_any_base *local_a0;
  auto_any_t _foreach_end345;
  auto_any_base *local_90;
  auto_any_t _foreach_cur345;
  pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> local_78;
  pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *local_68;
  auto_any_t _foreach_col345;
  directory_iterator eod;
  directory_iterator local_48;
  directory_iterator it;
  path targetDir;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *data_local;
  string *dir_name_local;
  
  boost::filesystem::path::path((path *)&it,dir_name);
  boost::filesystem::directory_iterator::directory_iterator(&local_48,(path *)&it,none);
  boost::filesystem::directory_iterator::directory_iterator((directory_iterator *)&_foreach_col345);
  std::make_pair<boost::filesystem::directory_iterator&,boost::filesystem::directory_iterator&>
            ((directory_iterator *)&_foreach_cur345,&local_48);
  boost::foreach_detail_::
  contain<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>>
            (&local_78,(true_ *)&_foreach_cur345);
  std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>::~pair
            ((pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *)
             &_foreach_cur345);
  local_68 = &local_78;
  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool((auto_any_base *)local_68);
  if (!bVar1) {
    boost::foreach_detail_::
    begin<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
              ((foreach_detail_ *)&_foreach_end345,(auto_any_t)local_68,
               (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                *)0x0,(true_ *)0x0);
    local_90 = (auto_any_base *)&_foreach_end345;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_90);
    if (bVar1) {
LAB_0013cbeb:
      bVar1 = false;
    }
    else {
      boost::foreach_detail_::
      end<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                ((foreach_detail_ *)&stack0xffffffffffffff58,(auto_any_t)local_68,
                 (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                  *)0x0,(true_ *)0x0);
      local_a0 = (auto_any_base *)&stack0xffffffffffffff58;
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_a0);
      if (!bVar1) {
        p._7_1_ = 1;
        while( true ) {
          local_364 = 0;
          if ((p._7_1_ & 1) != 0) {
            bVar1 = boost::foreach_detail_::
                    done<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                              (local_90,local_a0,
                               (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                                *)0x0);
            local_364 = bVar1 ^ 0xff;
          }
          if ((local_364 & 1) == 0) break;
          bVar1 = boost::foreach_detail_::set_false((bool *)((long)&p + 7));
          if (!bVar1) {
            this = boost::foreach_detail_::
                   deref<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                             (local_90,(type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                                        *)0x0);
            local_b8 = boost::filesystem::directory_entry::operator_cast_to_path_(this);
            while (((p._7_1_ ^ 0xff) & 1) != 0) {
              bVar1 = boost::filesystem::is_regular_file(local_b8);
              if (bVar1) {
                boost::filesystem::path::extension();
                bVar1 = boost::filesystem::operator==(&local_d8,"swp");
                boost::filesystem::path::~path(&local_d8);
                if (!bVar1) {
                  psVar3 = boost::filesystem::path::string_abi_cxx11_(local_b8);
                  std::ifstream::ifstream(&local_2e0,(string *)psVar3,_S_in);
                  bVar2 = std::ios::operator!((ios *)((long)&local_2e0 +
                                                     *(long *)(local_2e0 + -0x18)));
                  if ((bVar2 & 1) == 0) {
                    std::__cxx11::string::string
                              ((string *)
                               &concr_phrase.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_320);
                    while( true ) {
                      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                         ((istream *)&local_2e0,
                                          (string *)
                                          &concr_phrase.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      bVar1 = std::ios::operator_cast_to_bool
                                        ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
                      local_3b2 = 0;
                      if (bVar1) {
                        local_3b2 = std::__cxx11::string::empty();
                        local_3b2 = local_3b2 ^ 0xff;
                      }
                      if ((local_3b2 & 1) == 0) break;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_320,
                                  (value_type *)
                                  &concr_phrase.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    }
                    boost::filesystem::path::filename();
                    psVar3 = boost::filesystem::path::string_abi_cxx11_(&local_340);
                    std::
                    unordered_map<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    ::
                    emplace<std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                              ((unordered_map<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                *)data,psVar3,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_320);
                    boost::filesystem::path::~path(&local_340);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_320);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_320);
                    std::__cxx11::string::~string
                              ((string *)
                               &concr_phrase.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    bVar1 = false;
                  }
                  else {
                    poVar4 = std::operator<<((ostream *)&std::cerr,"File ");
                    psVar3 = boost::filesystem::path::string_abi_cxx11_(local_b8);
                    poVar4 = std::operator<<(poVar4,(string *)psVar3);
                    poVar4 = std::operator<<(poVar4,"doesn\'t exist");
                    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                    dir_name_local._7_1_ = 0;
                    bVar1 = true;
                  }
                  std::ifstream::~ifstream(&local_2e0);
                  if (bVar1) goto LAB_0013cbc3;
                }
              }
              p._7_1_ = 1;
            }
          }
          if ((p._7_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                      (local_90,(type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                                 *)0x0);
          }
        }
      }
      bVar1 = false;
LAB_0013cbc3:
      boost::foreach_detail_::auto_any<boost::filesystem::directory_iterator>::~auto_any
                ((auto_any<boost::filesystem::directory_iterator> *)&stack0xffffffffffffff58);
      if (!bVar1) goto LAB_0013cbeb;
    }
    boost::foreach_detail_::auto_any<boost::filesystem::directory_iterator>::~auto_any
              ((auto_any<boost::filesystem::directory_iterator> *)&_foreach_end345);
    if (bVar1) goto LAB_0013cc27;
  }
  bVar1 = false;
LAB_0013cc27:
  boost::foreach_detail_::
  auto_any<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>_>
  ::~auto_any((auto_any<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>_>
               *)&local_78);
  if (!bVar1) {
    dir_name_local._7_1_ = 1;
  }
  boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)&_foreach_col345)
  ;
  boost::filesystem::directory_iterator::~directory_iterator(&local_48);
  boost::filesystem::path::~path((path *)&it);
  return (bool)(dir_name_local._7_1_ & 1);
}

Assistant:

bool readPhrases(const std::string& dir_name, std::unordered_map<std::string, std::vector<std::string>>& data)
    {        
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::vector<std::string> concr_phrase;
                while (std::getline(fi, line) and !line.empty())
                {
                    //line.erase(line.find_last_not_of(" \n\r\t")+1);
                    concr_phrase.push_back(line);
                }
                data.emplace(p.filename().string(), concr_phrase);
                concr_phrase.clear();
            } 
        }
        return true;
    }